

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.hpp
# Opt level: O0

double * __thiscall tfs::TMatrix<double>::dataReadOnly(TMatrix<double> *this)

{
  TMatrix<double> *this_local;
  
  return this->m_data;
}

Assistant:

inline void randomize( DNN_NUMERIC scale ) {             // Fill matrix with small positive values
            // Weight normalization is done to equalize the output variance of every neuron,
            // otherwise neurons with a lot of incoming connections will have outputs with a larger variance
            if( isEmpty()) {
                log_error( "empty matrix" );
                return;
            }
            if( scale < 1.0 ) {
                scale = 1.0;
            }
            const DNN_NUMERIC max = sqrt( 1.0 / scale );
                  T *         ptr = m_data;
            const T * const   end = m_end;
            while( ptr < end ) {
                *ptr++ = (T) randn( max );
            }
        }